

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 CalcWindowContentSize(ImGuiWindow *window)

{
  long in_RDI;
  ImVec2 sz;
  float local_18;
  float local_14;
  ImVec2 local_8;
  
  if ((((*(byte *)(in_RDI + 0x81) & 1) == 0) || ('\0' < *(char *)(in_RDI + 0x94))) ||
     ('\0' < *(char *)(in_RDI + 0x95))) {
    if ((((*(byte *)(in_RDI + 0x85) & 1) == 0) || (*(int *)(in_RDI + 0xa0) != 0)) ||
       (*(int *)(in_RDI + 0x9c) < 1)) {
      ImVec2::ImVec2(&local_8);
      if ((*(float *)(in_RDI + 0x30) != 0.0) || (NAN(*(float *)(in_RDI + 0x30)))) {
        local_14 = *(float *)(in_RDI + 0x30);
      }
      else {
        local_14 = *(float *)(in_RDI + 0xe8) - *(float *)(in_RDI + 0xe0);
      }
      if ((*(float *)(in_RDI + 0x34) != 0.0) || (NAN(*(float *)(in_RDI + 0x34)))) {
        local_18 = *(float *)(in_RDI + 0x34);
      }
      else {
        local_18 = *(float *)(in_RDI + 0xec) - *(float *)(in_RDI + 0xe4);
      }
      local_8.y = (float)(int)local_18;
      local_8.x = (float)(int)local_14;
    }
    else {
      local_8 = *(ImVec2 *)(in_RDI + 0x28);
    }
  }
  else {
    local_8 = *(ImVec2 *)(in_RDI + 0x28);
  }
  return local_8;
}

Assistant:

static ImVec2 CalcWindowContentSize(ImGuiWindow* window)
{
    if (window->Collapsed)
        if (window->AutoFitFramesX <= 0 && window->AutoFitFramesY <= 0)
            return window->ContentSize;
    if (window->Hidden && window->HiddenFramesCannotSkipItems == 0 && window->HiddenFramesCanSkipItems > 0)
        return window->ContentSize;

    ImVec2 sz;
    sz.x = IM_FLOOR((window->ContentSizeExplicit.x != 0.0f) ? window->ContentSizeExplicit.x : window->DC.CursorMaxPos.x - window->DC.CursorStartPos.x);
    sz.y = IM_FLOOR((window->ContentSizeExplicit.y != 0.0f) ? window->ContentSizeExplicit.y : window->DC.CursorMaxPos.y - window->DC.CursorStartPos.y);
    return sz;
}